

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iibmalloc.cpp
# Opt level: O2

void * operator_new__(size_t count,align_val_t al)

{
  ulong uVar1;
  long lVar2;
  void *ret;
  anon_class_8_1_a8a78a16 aVar3;
  undefined8 *puVar4;
  uint8_t *puVar5;
  undefined1 *puVar6;
  uint uVar7;
  uint8_t szidx_00;
  IibAllocatorBase *this;
  long in_FS_OFFSET;
  format_to_n_result<char_*> fVar8;
  uint8_t szidx;
  undefined7 uStack_43f;
  uint8_t *local_438;
  align_val_t local_430;
  anon_class_8_1_a8a78a16 local_428 [127];
  undefined2 local_2c;
  undefined1 local_2a;
  undefined1 local_29 [9];
  
  this = *(IibAllocatorBase **)(in_FS_OFFSET + -0x20);
  local_438 = (uint8_t *)al;
  if (this == (IibAllocatorBase *)0x0) {
    local_430 = 0x20;
    _szidx = "{} vs. {}";
    if (0x20 < al) {
      fVar8 = fmt::v7::format_to_n<char_*,_const_char_*,_unsigned_long,_unsigned_long,_0>
                        ((char *)local_428,0x3ff,(char **)&szidx,(unsigned_long *)&local_438,
                         &local_430);
      if (fVar8.size < 0x400) {
        puVar6 = (undefined1 *)((long)&local_428[0].szidx + fVar8.size);
      }
      else {
        puVar6 = local_29;
        local_2c = 0x2e2e;
        local_2a = 0x2e;
      }
      *puVar6 = 0;
      nodecpp::assert::onAssertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.cpp"
                 ,0x83,"(size_t)al <= NODECPP_MAX_SUPPORTED_ALIGNMENT_FOR_NEW",(char *)local_428,
                 true);
    }
    aVar3.szidx = (uint8_t *)malloc(count);
    if (aVar3.szidx == (uint8_t *)0x0) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = clock_gettime;
      __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    goto LAB_0010e35a;
  }
  _szidx = "{} vs. {}";
  if (0x20 < al) {
    fVar8 = fmt::v7::format_to_n<char_*,_const_char_*,_unsigned_long,_unsigned_long,_0>
                      ((char *)local_428,0x3ff,(char **)&szidx,(unsigned_long *)&local_438,
                       &nodecpp::iibmalloc::IibAllocatorBase::maximalSupportedAlignment);
    if (fVar8.size < 0x400) {
      puVar6 = (undefined1 *)((long)&local_428[0].szidx + fVar8.size);
    }
    else {
      puVar6 = local_29;
      local_2c = 0x2e2e;
      local_2a = 0x2e;
    }
    *puVar6 = 0;
    nodecpp::assert::onAssertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.cpp"
               ,0x7e,"(size_t)al <= ThreadLocalAllocatorT::maximalSupportedAlignment",
               (char *)local_428,true);
    this = *(IibAllocatorBase **)(in_FS_OFFSET + -0x20);
  }
  if (count < 0x31) {
    puVar5 = (uint8_t *)this->buckets[6];
    if (puVar5 == (uint8_t *)0x0) {
      count = 0x31;
      szidx_00 = '\x06';
LAB_0010e30b:
      puVar5 = (uint8_t *)
               nodecpp::iibmalloc::IibAllocatorBase::allocateInCaseNoFreeBucket(this,count,szidx_00)
      ;
    }
    else {
      this->buckets[6] = *(void **)puVar5;
    }
  }
  else if (count < 0x2001) {
    uVar1 = count - 1;
    lVar2 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar7 = (uint)lVar2 ^ 0x3f;
    local_428[0].szidx = &szidx;
    szidx = 'y' - ((char)uVar7 * '\x02' - ((uVar1 >> ((ulong)(0x3e - uVar7) & 0x3f) & 1) != 0));
    nodecpp::assert::
    nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)0,nodecpp::iibmalloc::IibAllocatorBase::allocate(unsigned_long)::_lambda()_1_>
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
               ,0x459,local_428,"szidx < BucketCount");
    puVar5 = (uint8_t *)this->buckets[(ulong)_szidx & 0xff];
    szidx_00 = szidx;
    if (puVar5 == (uint8_t *)0x0) goto LAB_0010e30b;
    this->buckets[(ulong)_szidx & 0xff] = *(void **)puVar5;
  }
  else {
    puVar5 = (uint8_t *)
             nodecpp::iibmalloc::IibAllocatorBase::allocateInCaseTooLargeForBucket(this,count);
  }
  _szidx = (char *)local_428;
  local_430 = 0x20;
  local_438 = puVar5;
  local_428[0].szidx = puVar5;
  nodecpp::assert::
  nodecpp_assert<2ul,(nodecpp::assert::AssertLevel)2,nodecpp::iibmalloc::IibAllocatorBase::allocateAligned<32ul>(unsigned_long)::_lambda()_1_,unsigned_long,unsigned_long>
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
             ,0x4a4,(anon_class_8_1_ba1d7401 *)&szidx,"((uintptr_t)ret & (alignment - 1)) == 0",
             "ret = 0x{:x}, alignment = {}",(unsigned_long *)&local_438,&local_430);
  aVar3.szidx = local_428[0].szidx;
LAB_0010e35a:
  _szidx = "ret = 0x{:x}, al = {}";
  if ((al - 1 & (ulong)aVar3.szidx) != 0) {
    local_438 = aVar3.szidx;
    local_430 = al;
    fVar8 = fmt::v7::format_to_n<char_*,_const_char_*,_unsigned_long,_unsigned_long,_0>
                      ((char *)local_428,0x3ff,(char **)&szidx,(unsigned_long *)&local_438,
                       &local_430);
    if (fVar8.size < 0x400) {
      puVar6 = (undefined1 *)((long)&local_428[0].szidx + fVar8.size);
    }
    else {
      puVar6 = local_29;
      local_2c = 0x2e2e;
      local_2a = 0x2e;
    }
    *puVar6 = 0;
    nodecpp::assert::onAssertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.cpp"
               ,0x86,"( (size_t)ret & ((size_t)al - 1)) == 0",(char *)local_428,true);
  }
  return aVar3.szidx;
}

Assistant:

void* operator new[](std::size_t count, std::align_val_t al)
{
	void* ret;
	if ( g_CurrentAllocManager )
	{
		NODECPP_ASSERT( nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::pedantic, (size_t)al <= ThreadLocalAllocatorT::maximalSupportedAlignment, "{} vs. {}", (size_t)al, ThreadLocalAllocatorT::maximalSupportedAlignment );
		ret = g_CurrentAllocManager->allocateAligned<NODECPP_MAX_SUPPORTED_ALIGNMENT_FOR_NEW>(count);
	}
	else
	{
		NODECPP_ASSERT( nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::pedantic, (size_t)al <= NODECPP_MAX_SUPPORTED_ALIGNMENT_FOR_NEW, "{} vs. {}", (size_t)al, NODECPP_MAX_SUPPORTED_ALIGNMENT_FOR_NEW );
		ret = nodecpp::StdRawAllocator::allocate<NODECPP_MAX_SUPPORTED_ALIGNMENT_FOR_NEW>(count);
	}
	NODECPP_ASSERT( nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::pedantic, ( (size_t)ret & ((size_t)al - 1)) == 0, "ret = 0x{:x}, al = {}", (size_t)ret, (size_t)al );
	return ret; 
}